

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

int Abc_NtkReduceNodes(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes)

{
  int iVar1;
  void *pvVar2;
  Abc_Obj_t *pObj;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                  ,0x21d,"int Abc_NtkReduceNodes(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(vNodes), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar2 = Vec_PtrEntry(vNodes,local_24);
    *(uint *)((long)pvVar2 + 0x14) = *(uint *)((long)pvVar2 + 0x14) & 0xffffffef | 0x10;
  }
  local_28 = 0;
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj = Abc_NtkObj(pNtk,local_24);
    if (((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) &&
       ((*(uint *)&pObj->field_0x14 >> 4 & 1) == 0)) {
      Abc_NtkDeleteObj(pObj);
      local_28 = local_28 + 1;
    }
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(vNodes), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar2 = Vec_PtrEntry(vNodes,local_24);
    *(uint *)((long)pvVar2 + 0x14) = *(uint *)((long)pvVar2 + 0x14) & 0xffffffef;
  }
  iVar1 = Abc_NtkCheck(pNtk);
  if (iVar1 == 0) {
    printf("Abc_NtkCleanup: The network check has failed.\n");
  }
  return local_28;
}

Assistant:

int Abc_NtkReduceNodes( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pNode;
    int i, Counter;
    assert( Abc_NtkIsLogic(pNtk) );
    // mark the nodes reachable from the POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkA = 1;
    // remove the non-marked nodes
    Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( pNode->fMarkA == 0 )
        {
            Abc_NtkDeleteObj( pNode );
            Counter++;
        }
    // unmark the remaining nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkA = 0;
    // check
    if ( !Abc_NtkCheck( pNtk ) )
        printf( "Abc_NtkCleanup: The network check has failed.\n" );
    return Counter;
}